

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O2

bool __thiscall ON_PolylineCurve::Trim(ON_PolylineCurve *this,ON_Interval *domain)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ON_3dPoint *pOVar4;
  bool bVar5;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  double *pdVar12;
  ulong uVar13;
  long lVar14;
  ON_3dPoint *pOVar15;
  uint uVar16;
  double dVar17;
  int s1;
  double local_100;
  ON_Interval actual_trim_domain;
  int s0;
  double local_e0;
  ON_3dPoint Q1;
  ON_3dPoint Q0;
  ON_Interval output_domain;
  ON_3dPoint local_88;
  ON_Interval seg_domain;
  ON_Line seg_chord;
  ON_Interval original_polyline_domain;
  
  uVar3 = (this->m_t).m_count;
  if ((int)uVar3 < 2) {
    return false;
  }
  if (uVar3 != (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_count) {
    return false;
  }
  bVar11 = ON_Interval::IsIncreasing(domain);
  if (!bVar11) {
    return false;
  }
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  bVar11 = ON_Interval::IsIncreasing(&original_polyline_domain);
  if (!bVar11) {
    return false;
  }
  output_domain.m_t[0] = domain->m_t[0];
  output_domain.m_t[1] = domain->m_t[1];
  bVar11 = ON_Interval::Intersection(&output_domain,&original_polyline_domain);
  if (!bVar11) {
    return false;
  }
  bVar11 = ON_Interval::IsIncreasing(&output_domain);
  if (!bVar11) {
    return false;
  }
  actual_trim_domain.m_t[0] = output_domain.m_t[0];
  actual_trim_domain.m_t[1] = output_domain.m_t[1];
  s0 = -2;
  s1 = -3;
  pdVar12 = ON_Interval::operator[](&output_domain,0);
  bVar11 = ParameterSearch(this,*pdVar12,&s0,true);
  if ((uint)s0 < uVar3 && bVar11) {
    local_100 = (this->m_t).m_a[(uint)s0];
    pdVar12 = ON_Interval::operator[](&actual_trim_domain,0);
    *pdVar12 = local_100;
  }
  pdVar12 = ON_Interval::operator[](&output_domain,1);
  bVar11 = ParameterSearch(this,*pdVar12,&s1,true);
  if ((uint)s1 < uVar3 && bVar11) {
    local_100 = (this->m_t).m_a[(uint)s1];
    pdVar12 = ON_Interval::operator[](&actual_trim_domain,1);
    *pdVar12 = local_100;
    s1 = s1 + -1;
  }
  bVar11 = ON_Interval::IsIncreasing(&actual_trim_domain);
  if (!bVar11) {
    return false;
  }
  if (s0 < 0) {
    return false;
  }
  uVar16 = uVar3 - 1;
  if ((int)uVar16 <= s1 || s1 < s0) {
    return false;
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  bVar11 = ON_Interval::operator==(&actual_trim_domain,&original_polyline_domain);
  iVar2 = s0;
  if (bVar11) {
    pdVar12 = ON_Interval::operator[](&output_domain,0);
    *(this->m_t).m_a = *pdVar12;
    pdVar12 = ON_Interval::operator[](&output_domain,1);
    (this->m_t).m_a[uVar16] = *pdVar12;
    return true;
  }
  if (s1 < (int)(uVar3 - 2)) {
    iVar1 = s1 + 2;
    if ((-3 < s1) && (iVar1 <= (this->m_t).m_capacity)) {
      (this->m_t).m_count = iVar1;
    }
    if ((-3 < s1) &&
       (iVar1 <= (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_capacity))
    {
      (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_count = iVar1;
    }
    uVar16 = s1 + 1;
  }
  lVar14 = (long)s0;
  if (0 < lVar14) {
    pOVar15 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
    pdVar12 = (this->m_t).m_a;
    for (; s0 <= (int)uVar16; s0 = s0 + 1) {
      *pdVar12 = pdVar12[lVar14];
      pOVar15->z = pOVar15[lVar14].z;
      dVar17 = pOVar15[lVar14].y;
      pOVar15->x = pOVar15[lVar14].x;
      pOVar15->y = dVar17;
      pOVar15 = pOVar15 + 1;
      pdVar12 = pdVar12 + 1;
    }
    s0 = 0;
    s1 = s1 - iVar2;
    iVar2 = s1 + 2;
    if ((-3 < s1) && (iVar2 <= (this->m_t).m_capacity)) {
      (this->m_t).m_count = iVar2;
    }
    if ((-3 < s1) &&
       (iVar2 <= (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_capacity))
    {
      (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_count = iVar2;
    }
  }
  local_100 = *(this->m_t).m_a;
  pdVar12 = ON_Interval::operator[](&actual_trim_domain,0);
  bVar11 = true;
  if (*pdVar12 <= local_100) {
    if (s1 == 0) {
      pdVar12 = ON_Interval::operator[](&actual_trim_domain,1);
      dVar17 = (this->m_t).m_a[1];
      bVar11 = *pdVar12 <= dVar17 && dVar17 != *pdVar12;
    }
    else {
      bVar11 = false;
    }
  }
  if (s0 < s1) {
    local_100 = (this->m_t).m_a[s1];
    pdVar12 = ON_Interval::operator[](&actual_trim_domain,1);
    if (local_100 < *pdVar12) {
      pdVar12 = ON_Interval::operator[](&actual_trim_domain,1);
      dVar17 = (this->m_t).m_a[(long)s1 + 1];
      bVar5 = *pdVar12 <= dVar17 && dVar17 != *pdVar12;
      goto LAB_0059dc1b;
    }
  }
  bVar5 = false;
LAB_0059dc1b:
  if (bVar11) {
    pdVar12 = (this->m_t).m_a;
    ON_Interval::ON_Interval(&seg_domain,*pdVar12,pdVar12[1]);
    pOVar15 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
    Q0.z = pOVar15->z;
    Q0.x = pOVar15->x;
    Q0.y = pOVar15->y;
    Q1.z = pOVar15[1].z;
    Q1.x = pOVar15[1].x;
    Q1.y = pOVar15[1].y;
    ON_Line::ON_Line(&seg_chord,*pOVar15,pOVar15[1]);
    local_e0 = *(this->m_t).m_a;
    pdVar12 = ON_Interval::operator[](&actual_trim_domain,0);
    local_100 = 0.0;
    if ((*pdVar12 <= local_e0) ||
       (pdVar12 = ON_Interval::operator[](&actual_trim_domain,0), dVar17 = (this->m_t).m_a[1],
       dVar17 < *pdVar12 || dVar17 == *pdVar12)) {
      bVar11 = false;
    }
    else {
      pdVar12 = ON_Interval::operator[](&actual_trim_domain,0);
      local_100 = ON_Interval::NormalizedParameterAt(&seg_domain,*pdVar12);
      ON_Line::PointAt(&local_88,&seg_chord,local_100);
      Q0.z = local_88.z;
      Q0.x = local_88.x;
      Q0.y = local_88.y;
      bVar11 = true;
    }
    if (s1 == 0) {
      local_e0 = *(this->m_t).m_a;
      pdVar12 = ON_Interval::operator[](&actual_trim_domain,1);
      if ((*pdVar12 <= local_e0) ||
         (pdVar12 = ON_Interval::operator[](&actual_trim_domain,1), dVar17 = (this->m_t).m_a[1],
         dVar17 < *pdVar12 || dVar17 == *pdVar12)) {
        bVar6 = false;
        dVar17 = 1.0;
      }
      else {
        pdVar12 = ON_Interval::operator[](&actual_trim_domain,1);
        local_e0 = ON_Interval::NormalizedParameterAt(&seg_domain,*pdVar12);
        ON_Line::PointAt(&local_88,&seg_chord,local_e0);
        Q1.z = local_88.z;
        Q1.x = local_88.x;
        Q1.y = local_88.y;
        bVar6 = true;
        dVar17 = local_e0;
      }
    }
    else {
      bVar6 = false;
      dVar17 = 1.0;
    }
    if (dVar17 <= local_100) {
      ON_Line::~ON_Line(&seg_chord);
      return false;
    }
    if (bVar11) {
      if (((0.9999999850988388 <= local_100) &&
          (dVar17 = ON_3dPoint::DistanceTo(&Q0,&Q1), dVar17 <= 2.3283064365386963e-10)) && (0 < s1))
      {
        local_100 = (this->m_t).m_a[1];
        pdVar12 = ON_Interval::operator[](&actual_trim_domain,1);
        if (local_100 < *pdVar12) {
          ON_SimpleArray<double>::Remove(&this->m_t,0);
          ON_SimpleArray<ON_3dPoint>::Remove((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,0);
          s1 = s1 + -1;
          local_100 = *(this->m_t).m_a;
          pdVar12 = ON_Interval::operator[](&actual_trim_domain,0);
          *pdVar12 = local_100;
        }
      }
      pdVar12 = ON_Interval::operator[](&actual_trim_domain,0);
      *(this->m_t).m_a = *pdVar12;
      pOVar15 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
      pOVar15->z = Q0.z;
      pOVar15->x = Q0.x;
      pOVar15->y = Q0.y;
    }
    if (bVar6) {
      pdVar12 = ON_Interval::operator[](&actual_trim_domain,1);
      (this->m_t).m_a[1] = *pdVar12;
      pOVar15 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
      pOVar15[1].z = Q1.z;
      pOVar15[1].x = Q1.x;
      pOVar15[1].y = Q1.y;
    }
    ON_Line::~ON_Line(&seg_chord);
  }
  if (bVar5) {
    pdVar12 = (this->m_t).m_a;
    ON_Interval::ON_Interval(&seg_domain,pdVar12[s1],pdVar12[(long)s1 + 1]);
    lVar14 = (long)s1;
    pOVar4 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
    pOVar15 = pOVar4 + lVar14;
    Q0.x = pOVar15->x;
    Q0.y = pOVar15->y;
    uVar7 = pOVar15->x;
    uVar8 = pOVar15->y;
    from_pt.y = (double)uVar8;
    from_pt.x = (double)uVar7;
    Q0.z = pOVar4[lVar14].z;
    Q1.z = pOVar4[lVar14 + 1].z;
    pOVar4 = pOVar4 + lVar14 + 1;
    Q1.x = pOVar4->x;
    Q1.y = pOVar4->y;
    uVar9 = pOVar4->x;
    uVar10 = pOVar4->y;
    to_pt.y = (double)uVar10;
    to_pt.x = (double)uVar9;
    from_pt.z = Q0.z;
    to_pt.z = Q1.z;
    ON_Line::ON_Line(&seg_chord,from_pt,to_pt);
    pdVar12 = ON_Interval::operator[](&actual_trim_domain,1);
    local_100 = ON_Interval::NormalizedParameterAt(&seg_domain,*pdVar12);
    ON_Line::PointAt(&local_88,&seg_chord,local_100);
    Q1.z = local_88.z;
    Q1.x = local_88.x;
    Q1.y = local_88.y;
    if ((local_100 <= 1.490116119385e-08) &&
       (dVar17 = ON_3dPoint::DistanceTo(&Q1,&Q0), 0 < s1 && dVar17 <= 2.3283064365386963e-10)) {
      uVar13 = (ulong)(uint)s1;
      if (s1 < (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_capacity) {
        (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_count = s1 + 1;
      }
      if (s1 < (this->m_t).m_capacity) {
        (this->m_t).m_count = s1 + 1;
      }
      s1 = s1 + -1;
      local_100 = (this->m_t).m_a[uVar13];
      pdVar12 = ON_Interval::operator[](&actual_trim_domain,1);
      *pdVar12 = local_100;
    }
    pdVar12 = ON_Interval::operator[](&actual_trim_domain,1);
    (this->m_t).m_a[(long)s1 + 1] = *pdVar12;
    lVar14 = (long)s1 + 1;
    pOVar15 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
    pOVar15[lVar14].z = Q1.z;
    pOVar15 = pOVar15 + lVar14;
    pOVar15->x = Q1.x;
    pOVar15->y = Q1.y;
    ON_Line::~ON_Line(&seg_chord);
  }
  pdVar12 = ON_Interval::operator[](&output_domain,0);
  *(this->m_t).m_a = *pdVar12;
  pdVar12 = ON_Interval::operator[](&output_domain,1);
  (this->m_t).m_a[(long)(this->m_t).m_count + -1] = *pdVar12;
  return true;
}

Assistant:

bool
ON_PolylineCurve::SwapCoordinates( int i, int j )
{
	DestroyCurveTree();
  return m_pline.SwapCoordinates(i,j);
}